

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O3

int NCONF_load_bio(CONF *conf,BIO *bp,long *eline)

{
  byte bVar1;
  char *pcVar2;
  char **ppcVar3;
  lhash_st_CONF_VALUE *section_00;
  lhash_st_CONF_SECTION *value;
  CONF *pCVar4;
  int iVar5;
  uint uVar6;
  BUF_MEM *str;
  CONF_SECTION *pCVar7;
  undefined4 extraout_var;
  size_t sVar8;
  ulong uVar9;
  byte *from;
  byte *pbVar10;
  char *pcVar11;
  size_t sVar12;
  undefined4 extraout_var_00;
  CONF_VALUE *pCVar13;
  undefined4 extraout_var_01;
  byte *pbVar14;
  long lVar15;
  char **pto;
  char **ppcVar16;
  uint uVar17;
  uint uVar18;
  CONF_VALUE *pCVar19;
  int iVar20;
  CONF_VALUE *pCVar21;
  byte *section_01;
  CONF_VALUE *pCVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  char *section;
  long local_68;
  CONF local_60;
  undefined8 local_50;
  CONF_SECTION *local_48;
  CONF *local_40;
  BIO *local_38;
  
  local_60.values = (lhash_st_CONF_VALUE *)0x0;
  str = BUF_MEM_new();
  if (str == (BUF_MEM *)0x0) {
    iVar5 = 7;
    iVar20 = 0x17f;
LAB_00228cc0:
    ERR_put_error(0xd,0,iVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,iVar20);
  }
  else {
    local_60.values = (lhash_st_CONF_VALUE *)OPENSSL_strdup("default");
    if ((CONF_VALUE *)local_60.values != (CONF_VALUE *)0x0) {
      pCVar7 = NCONF_new_section((CONF *)conf,(char *)local_60.values);
      if (pCVar7 != (CONF_SECTION *)0x0) {
        iVar5 = BUF_MEM_grow(str,0x200);
        if (CONCAT44(extraout_var,iVar5) != 0) {
          local_68 = 0;
          local_48 = pCVar7;
          local_40 = conf;
          local_38 = bp;
LAB_002287aa:
          lVar23 = 0;
          bVar26 = false;
          uVar18 = 0;
LAB_002287b2:
          pcVar2 = str->data;
          pcVar11 = pcVar2 + lVar23;
          pcVar2[lVar23] = '\0';
          BIO_gets(local_38,pcVar11,0x1ff);
          pcVar2[lVar23 + 0x1ff] = '\0';
          sVar8 = strlen(pcVar11);
          pCVar4 = local_40;
          uVar6 = (uint)sVar8;
          if ((bool)(~bVar26 & uVar6 == 0)) {
            BUF_MEM_free(str);
            OPENSSL_free(local_60.values);
            return 1;
          }
          uVar9 = sVar8 & 0xffffffff;
          if (0 < (int)uVar6) {
            uVar9 = (ulong)(uVar6 & 0x7fffffff);
            do {
              if ((pcVar11[uVar9 - 1] != '\r') && (pcVar11[uVar9 - 1] != '\n')) goto LAB_00228827;
              bVar26 = 1 < (long)uVar9;
              uVar9 = uVar9 - 1;
            } while (bVar26);
            uVar9 = 0;
          }
LAB_00228827:
          bVar24 = uVar6 != 0;
          uVar17 = (uint)uVar9;
          bVar25 = uVar17 == uVar6;
          if (!bVar25 || !bVar24) {
            pcVar11[(int)uVar17] = '\0';
            local_68 = local_68 + 1;
          }
          bVar26 = SCARRY4(uVar17,uVar18);
          uVar18 = uVar17 + uVar18;
          if (uVar18 == 0 || bVar26 != (int)uVar18 < 0) {
LAB_00228873:
            bVar26 = true;
            if (!bVar25 || !bVar24) {
              pCVar19 = (CONF_VALUE *)str->data;
              pCVar21 = pCVar19;
              while ((uVar9 = (ulong)*(byte *)&pCVar21->section, uVar9 < 0x21 &&
                     ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0))) {
                pCVar21 = (CONF_VALUE *)((long)&pCVar21->section + 1);
              }
              do {
                uVar18 = (uint)uVar9;
                if (uVar18 < 0x27) {
                  if (uVar18 == 0x22) goto LAB_002288b2;
                  pCVar22 = pCVar19;
                  if (uVar18 == 0) goto LAB_0022894e;
                  if (uVar18 == 0x23) goto code_r0x00228947;
LAB_0022890c:
                  pCVar21 = (CONF_VALUE *)((long)&pCVar21->section + 1);
                }
                else {
                  if (uVar18 != 0x27) {
                    if (uVar18 == 0x5c) {
                      ppcVar16 = &pCVar21->section;
                      ppcVar3 = &pCVar21->section;
                      pCVar21 = (CONF_VALUE *)((long)&pCVar21->section + 2);
                      if (*(byte *)((long)ppcVar3 + 1) == 0) {
                        pCVar21 = (CONF_VALUE *)((long)ppcVar16 + 1);
                      }
                      goto LAB_00228924;
                    }
                    if (uVar18 != 0x60) goto LAB_0022890c;
                  }
LAB_002288b2:
                  bVar1 = *(byte *)((long)&pCVar21->section + 1);
                  pCVar22 = pCVar21;
                  while( true ) {
                    pCVar13 = (CONF_VALUE *)((long)&pCVar22->section + 1);
                    if ((bVar1 == 0) || (bVar1 == (byte)uVar9)) break;
                    if ((bVar1 == 0x5c) &&
                       (pCVar13 = (CONF_VALUE *)((long)&pCVar22->section + 2), pCVar21 = pCVar13,
                       *(byte *)((long)&pCVar22->section + 2) == 0)) goto LAB_00228924;
                    bVar1 = *(byte *)((long)&pCVar13->section + 1);
                    pCVar22 = pCVar13;
                  }
                  pCVar21 = (CONF_VALUE *)((long)&pCVar22->section + 2);
                  if (bVar1 != (byte)uVar9) {
                    pCVar21 = pCVar13;
                  }
                }
LAB_00228924:
                uVar9 = (ulong)*(byte *)&pCVar21->section;
              } while( true );
            }
          }
          else {
            if ((str->data[(ulong)uVar18 - 1] != '\\') ||
               ((uVar18 != 1 && (str->data[(ulong)uVar18 - 2] == '\\')))) goto LAB_00228873;
            uVar18 = uVar18 - 1;
            bVar26 = true;
          }
          goto LAB_00228b7d;
        }
        local_68 = 0;
LAB_00228d17:
        pCVar21 = (CONF_VALUE *)0x0;
        ERR_put_error(0xd,0,7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                      ,0x192);
        goto LAB_00228cc8;
      }
      iVar5 = 0x68;
      iVar20 = 0x18a;
      goto LAB_00228cc0;
    }
  }
  local_68 = 0;
  pCVar21 = (CONF_VALUE *)0x0;
LAB_00228cc8:
  BUF_MEM_free(str);
  OPENSSL_free(local_60.values);
  if (eline != (long *)0x0) {
    *eline = local_68;
  }
  ERR_add_error_dataf("line %ld",local_68);
  value_free(pCVar21);
  return 0;
code_r0x00228947:
  *(byte *)&pCVar21->section = 0;
LAB_0022894e:
  do {
    pCVar22 = (CONF_VALUE *)((long)&pCVar22->section + 1);
    uVar9 = (ulong)*(byte *)&pCVar19->section;
    if (0x20 < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0) goto LAB_00228b78;
      break;
    }
    pCVar19 = (CONF_VALUE *)((long)&pCVar19->section + 1);
  } while( true );
  if (*(byte *)&pCVar19->section == 0x5b) goto LAB_00228ba9;
  from = (byte *)eat_name((char *)pCVar19);
  if ((*from == 0x3a) && (from[1] == 0x3a)) {
    *from = 0;
    pCVar21 = (CONF_VALUE *)(from + 2);
    from = (byte *)eat_name((char *)pCVar21);
    pbVar14 = from;
    pCVar22 = pCVar19;
    pCVar19 = pCVar21;
    pbVar10 = from;
  }
  else {
    pCVar22 = (CONF_VALUE *)0x0;
    pbVar14 = from;
    pbVar10 = from;
  }
  while( true ) {
    section_01 = pbVar14 + 1;
    uVar9 = (ulong)*pbVar14;
    if (0x3d < uVar9) goto LAB_00228d6f;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) break;
    from = from + 1;
    pbVar14 = section_01;
  }
  if (uVar9 != 0x3d) {
LAB_00228d6f:
    iVar5 = 0x66;
    iVar20 = 499;
    goto LAB_00228d8b;
  }
  *pbVar10 = 0;
  lVar23 = 2;
  while (((ulong)*section_01 < 0x21 && ((0x100002600U >> ((ulong)*section_01 & 0x3f) & 1) != 0))) {
    section_01 = section_01 + 1;
    lVar23 = lVar23 + 1;
  }
  do {
    pbVar14 = from;
    lVar23 = lVar23 + -1;
    from = pbVar14 + 1;
  } while (pbVar14[1] != 0);
  if (lVar23 != 0) {
    lVar15 = 0;
    do {
      if ((0x20 < (ulong)pbVar14[lVar15]) ||
         ((0x100002600U >> ((ulong)pbVar14[lVar15] & 0x3f) & 1) == 0)) break;
      lVar15 = lVar15 + -1;
    } while (lVar23 != lVar15);
    from = from + lVar15;
  }
  *from = 0;
  pCVar21 = (CONF_VALUE *)OPENSSL_zalloc(0x18);
  if (pCVar21 == (CONF_VALUE *)0x0) {
    pCVar21 = (CONF_VALUE *)0x0;
    goto LAB_00228cc8;
  }
  if (pCVar22 == (CONF_VALUE *)0x0) {
    pCVar22 = (CONF_VALUE *)local_60.values;
  }
  pcVar11 = OPENSSL_strdup((char *)pCVar19);
  pCVar21->name = pcVar11;
  if ((pcVar11 == (char *)0x0) ||
     (iVar5 = str_copy((CONF *)&pCVar21->value,(char *)section_01,pto,(char *)from), iVar5 == 0))
  goto LAB_00228cc8;
  iVar5 = strcmp((char *)pCVar22,(char *)local_60.values);
  pCVar4 = local_40;
  pCVar7 = local_48;
  if (iVar5 != 0) {
    local_50 = 0;
    local_60.sections = (lhash_st_CONF_SECTION *)pCVar22;
    pCVar7 = (CONF_SECTION *)
             OPENSSL_lh_retrieve((_LHASH *)local_40->meth_data,&local_60.sections,
                                 lh_CONF_SECTION_call_hash_func,lh_CONF_SECTION_call_cmp_func);
    if ((pCVar7 == (CONF_SECTION *)0x0) &&
       (pCVar7 = NCONF_new_section((CONF *)pCVar4,(char *)pCVar22), pCVar7 == (CONF_SECTION *)0x0))
    {
      iVar5 = 0x68;
      iVar20 = 0x217;
      goto LAB_00228d5b;
    }
  }
  pcVar11 = OPENSSL_strdup(pCVar7->name);
  pCVar21->section = pcVar11;
  if ((pcVar11 == (char *)0x0) ||
     (sVar12 = OPENSSL_sk_push((OPENSSL_STACK *)pCVar7->values,pCVar21), sVar12 == 0))
  goto LAB_00228cc8;
  local_60.sections = (lhash_st_CONF_SECTION *)0x0;
  iVar5 = OPENSSL_lh_insert((_LHASH *)pCVar4->meth,&local_60.sections,pCVar21,
                            lh_CONF_VALUE_call_hash_func,lh_CONF_VALUE_call_cmp_func);
  value = local_60.sections;
  if (iVar5 == 0) {
    OPENSSL_sk_pop((OPENSSL_STACK *)pCVar7->values);
    goto LAB_00228cc8;
  }
  if ((CONF_VALUE *)local_60.sections != (CONF_VALUE *)0x0) {
    OPENSSL_sk_delete_ptr((OPENSSL_STACK *)pCVar7->values,local_60.sections);
    value_free((CONF_VALUE *)value);
  }
LAB_00228b78:
  uVar18 = 0;
  bVar26 = bVar25 && bVar24;
LAB_00228b7d:
  lVar23 = (long)(int)uVar18;
  iVar5 = BUF_MEM_grow(str,lVar23 + 0x200);
  if (CONCAT44(extraout_var_00,iVar5) == 0) goto LAB_00228d17;
  goto LAB_002287b2;
LAB_00228ba9:
  while ((pCVar19 = pCVar22, (ulong)*(byte *)&pCVar22->section < 0x21 &&
         ((0x100002600U >> ((ulong)*(byte *)&pCVar22->section & 0x3f) & 1) != 0))) {
    pCVar22 = (CONF_VALUE *)((long)&pCVar22->section + 1);
  }
  do {
    pCVar13 = (CONF_VALUE *)eat_name((char *)pCVar19);
    pCVar21 = pCVar13;
    while( true ) {
      ppcVar16 = (char **)(ulong)*(byte *)&pCVar21->section;
      if ((char **)0x20 < ppcVar16) break;
      if ((0x100002600U >> ((ulong)ppcVar16 & 0x3f) & 1) == 0) {
        if (ppcVar16 == (char **)0x0) goto LAB_00228d3f;
        break;
      }
      pCVar21 = (CONF_VALUE *)((long)&pCVar21->section + 1);
    }
    if (*(byte *)&pCVar21->section == 0x5d) break;
    bVar26 = pCVar21 == pCVar19;
    pCVar19 = pCVar21;
    if (bVar26) {
LAB_00228d3f:
      pCVar21 = (CONF_VALUE *)0x0;
      iVar5 = 0x65;
      iVar20 = 0x1d7;
LAB_00228d5b:
      ERR_put_error(0xd,0,iVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                    ,iVar20);
      goto LAB_00228cc8;
    }
  } while( true );
  *(byte *)&pCVar13->section = 0;
  iVar5 = str_copy(&local_60,(char *)pCVar22,ppcVar16,(char *)pCVar21);
  section_00 = local_60.values;
  if (iVar5 == 0) {
    pCVar21 = (CONF_VALUE *)0x0;
    goto LAB_00228cc8;
  }
  local_50 = 0;
  local_60.sections = (lhash_st_CONF_SECTION *)local_60.values;
  pCVar7 = (CONF_SECTION *)
           OPENSSL_lh_retrieve((_LHASH *)pCVar4->meth_data,&local_60.sections,
                               lh_CONF_SECTION_call_hash_func,lh_CONF_SECTION_call_cmp_func);
  if ((pCVar7 == (CONF_SECTION *)0x0) &&
     (pCVar7 = NCONF_new_section((CONF *)pCVar4,(char *)section_00), pCVar7 == (CONF_SECTION *)0x0))
  {
    iVar5 = 0x68;
    iVar20 = 0x1e2;
LAB_00228d8b:
    pCVar21 = (CONF_VALUE *)0x0;
    ERR_put_error(0xd,0,iVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,iVar20);
    goto LAB_00228cc8;
  }
  local_48 = pCVar7;
  iVar5 = BUF_MEM_grow(str,0x200);
  if (CONCAT44(extraout_var_01,iVar5) == 0) goto LAB_00228d17;
  goto LAB_002287aa;
}

Assistant:

int NCONF_load_bio(CONF *conf, BIO *in, long *out_error_line) {
  static const size_t CONFBUFSIZE = 512;
  int bufnum = 0, i, ii;
  BUF_MEM *buff = NULL;
  char *s, *p, *end;
  int again;
  long eline = 0;
  CONF_VALUE *v = NULL;
  CONF_SECTION *sv = NULL;
  char *section = NULL, *buf;
  char *start, *psection, *pname;

  if ((buff = BUF_MEM_new()) == NULL) {
    OPENSSL_PUT_ERROR(CONF, ERR_R_BUF_LIB);
    goto err;
  }

  section = OPENSSL_strdup(kDefaultSectionName);
  if (section == NULL) {
    goto err;
  }

  sv = NCONF_new_section(conf, section);
  if (sv == NULL) {
    OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
    goto err;
  }

  bufnum = 0;
  again = 0;
  for (;;) {
    if (!BUF_MEM_grow(buff, bufnum + CONFBUFSIZE)) {
      OPENSSL_PUT_ERROR(CONF, ERR_R_BUF_LIB);
      goto err;
    }
    p = &(buff->data[bufnum]);
    *p = '\0';
    BIO_gets(in, p, CONFBUFSIZE - 1);
    p[CONFBUFSIZE - 1] = '\0';
    ii = i = strlen(p);
    if (i == 0 && !again) {
      break;
    }
    again = 0;
    while (i > 0) {
      if ((p[i - 1] != '\r') && (p[i - 1] != '\n')) {
        break;
      } else {
        i--;
      }
    }
    // we removed some trailing stuff so there is a new
    // line on the end.
    if (ii && i == ii) {
      again = 1;  // long line
    } else {
      p[i] = '\0';
      eline++;  // another input line
    }

    // we now have a line with trailing \r\n removed

    // i is the number of bytes
    bufnum += i;

    v = NULL;
    // check for line continuation
    if (bufnum >= 1) {
      // If we have bytes and the last char '\\' and
      // second last char is not '\\'
      p = &(buff->data[bufnum - 1]);
      if (is_esc(p[0]) && ((bufnum <= 1) || !is_esc(p[-1]))) {
        bufnum--;
        again = 1;
      }
    }
    if (again) {
      continue;
    }
    bufnum = 0;
    buf = buff->data;

    clear_comments(buf);
    s = eat_ws(buf);
    if (*s == '\0') {
      continue;  // blank line
    }
    if (*s == '[') {
      char *ss;

      s++;
      start = eat_ws(s);
      ss = start;
    again:
      end = eat_name(ss);
      p = eat_ws(end);
      if (*p != ']') {
        if (*p != '\0' && ss != p) {
          ss = p;
          goto again;
        }
        OPENSSL_PUT_ERROR(CONF, CONF_R_MISSING_CLOSE_SQUARE_BRACKET);
        goto err;
      }
      *end = '\0';
      if (!str_copy(conf, NULL, &section, start)) {
        goto err;
      }
      if ((sv = get_section(conf, section)) == NULL) {
        sv = NCONF_new_section(conf, section);
      }
      if (sv == NULL) {
        OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
        goto err;
      }
      continue;
    } else {
      pname = s;
      psection = NULL;
      end = eat_name(s);
      if ((end[0] == ':') && (end[1] == ':')) {
        *end = '\0';
        end += 2;
        psection = pname;
        pname = end;
        end = eat_name(end);
      }
      p = eat_ws(end);
      if (*p != '=') {
        OPENSSL_PUT_ERROR(CONF, CONF_R_MISSING_EQUAL_SIGN);
        goto err;
      }
      *end = '\0';
      p++;
      start = eat_ws(p);
      while (*p != '\0') {
        p++;
      }
      p--;
      while (p != start && is_conf_ws(*p)) {
        p--;
      }
      p++;
      *p = '\0';

      if (!(v = CONF_VALUE_new())) {
        goto err;
      }
      if (psection == NULL) {
        psection = section;
      }
      v->name = OPENSSL_strdup(pname);
      if (v->name == NULL) {
        goto err;
      }
      if (!str_copy(conf, psection, &(v->value), start)) {
        goto err;
      }

      CONF_SECTION *tv;
      if (strcmp(psection, section) != 0) {
        if ((tv = get_section(conf, psection)) == NULL) {
          tv = NCONF_new_section(conf, psection);
        }
        if (tv == NULL) {
          OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
          goto err;
        }
      } else {
        tv = sv;
      }
      if (add_string(conf, tv, v) == 0) {
        goto err;
      }
      v = NULL;
    }
  }
  BUF_MEM_free(buff);
  OPENSSL_free(section);
  return 1;

err:
  BUF_MEM_free(buff);
  OPENSSL_free(section);
  if (out_error_line != NULL) {
    *out_error_line = eline;
  }
  ERR_add_error_dataf("line %ld", eline);
  value_free(v);
  return 0;
}